

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::mulew(Matrix *this,Matrix *mat)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint j;
  ulong uVar7;
  
  uVar6 = (this->m_shape).field_0.m_dims[0];
  if (uVar6 == (mat->m_shape).field_0.m_dims[0]) {
    uVar5 = (this->m_shape).field_0.m_dims[1];
    if (uVar5 == (mat->m_shape).field_0.m_dims[1]) {
      for (uVar4 = 0; uVar4 < uVar6; uVar4 = uVar4 + 1) {
        pvVar1 = (mat->m_vals).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->m_vals).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
          lVar3 = *(long *)&pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          *(double *)(lVar3 + uVar7 * 8) =
               *(double *)
                (*(long *)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl
                + uVar7 * 8) * *(double *)(lVar3 + uVar7 * 8);
          uVar5 = (this->m_shape).field_0.m_dims[1];
        }
        uVar6 = (this->m_shape).field_0.m_dims[0];
      }
      return this;
    }
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR [element-wise multiplication]: Shapes don\'t match!\n");
  exit(1);
}

Assistant:

Matrix& Matrix::mulew(const Matrix& mat){
    if(m_shape!=mat.m_shape){
        std::cout<<"ERROR [element-wise multiplication]: Shapes don't match!\n";
        exit(1);
    }

    for(uint i=0;i<m_shape.n_row;++i){
        for(uint j=0;j<m_shape.n_col;++j){
            m_vals[i][j]*=mat.m_vals[i][j];
        }
    }
    return *this;
}